

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetConstant(SQFuncState *this,SQObject *cons)

{
  SQTable *pSVar1;
  bool bVar2;
  SQObjectPtr local_58 [2];
  SQObjectPtr local_38;
  undefined1 local_28 [8];
  SQObjectPtr val;
  SQObject *cons_local;
  SQFuncState *this_local;
  
  val.super_SQObject._unVal = (SQObjectValue)cons;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_28);
  pSVar1 = (this->_literals).super_SQObject._unVal.pTable;
  ::SQObjectPtr::SQObjectPtr(&local_38,(SQObject *)val.super_SQObject._unVal.pTable);
  bVar2 = SQTable::Get(pSVar1,&local_38,(SQObjectPtr *)local_28);
  ::SQObjectPtr::~SQObjectPtr(&local_38);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ::SQObjectPtr::operator=((SQObjectPtr *)local_28,this->_nliterals);
    pSVar1 = (this->_literals).super_SQObject._unVal.pTable;
    ::SQObjectPtr::SQObjectPtr(local_58,(SQObject *)val.super_SQObject._unVal.pTable);
    SQTable::NewSlot(pSVar1,local_58,(SQObjectPtr *)local_28);
    ::SQObjectPtr::~SQObjectPtr(local_58);
    this->_nliterals = this->_nliterals + 1;
    if (0x7fffffff < this->_nliterals) {
      ::SQObjectPtr::Null((SQObjectPtr *)local_28);
      Error(this,"internal compiler error: too many literals");
    }
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_28);
  return val.super_SQObject._0_8_;
}

Assistant:

SQInteger SQFuncState::GetConstant(const SQObject &cons)
{
    SQObjectPtr val;
    if(!_table(_literals)->Get(cons,val))
    {
        val = _nliterals;
        _table(_literals)->NewSlot(cons,val);
        _nliterals++;
        if(_nliterals > MAX_LITERALS) {
            val.Null();
            Error(_SC("internal compiler error: too many literals"));
        }
    }
    return _integer(val);
}